

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

Point3f __thiscall
pbrt::RealisticCamera::SampleExitPupil
          (RealisticCamera *this,Point2f pFilm,Point2f lensSample,Float *sampleBoundsArea)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  size_t sVar5;
  Bounds2<float> *pBVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar14 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar15 [64];
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 in_ZMM5 [64];
  Point3f PVar19;
  
  auVar15._8_56_ = in_register_00001248;
  auVar15._0_8_ = lensSample.super_Tuple2<pbrt::Point2,_float>;
  auVar14._8_56_ = in_register_00001208;
  auVar14._0_8_ = pFilm.super_Tuple2<pbrt::Point2,_float>;
  auVar13 = vmovshdup_avx(auVar14._0_16_);
  fVar12 = pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  sVar5 = (this->exitPupilBounds).nStored;
  fVar16 = auVar13._0_4_;
  auVar8 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,sVar5);
  iVar10 = (int)sVar5 + -1;
  pBVar6 = (this->exitPupilBounds).ptr;
  auVar18 = ZEXT416((uint)(fVar12 * fVar12 + fVar16 * fVar16));
  auVar18 = vsqrtss_avx(auVar18,auVar18);
  fVar17 = auVar18._0_4_;
  iVar11 = (int)((fVar17 / (*(float *)(((this->super_CameraBase).film.
                                        super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                                       0xffffffffffff) + 0x20) * 0.5)) * auVar8._0_4_);
  if (iVar11 <= iVar10) {
    iVar10 = iVar11;
  }
  fVar1 = pBVar6[iVar10].pMin.super_Tuple2<pbrt::Point2,_float>.x;
  fVar2 = pBVar6[iVar10].pMin.super_Tuple2<pbrt::Point2,_float>.y;
  fVar3 = pBVar6[iVar10].pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fVar4 = pBVar6[iVar10].pMax.super_Tuple2<pbrt::Point2,_float>.y;
  if (sampleBoundsArea != (Float *)0x0) {
    *sampleBoundsArea = (fVar3 - fVar1) * (fVar4 - fVar2);
  }
  auVar18 = vmovshdup_avx(auVar15._0_16_);
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                           ZEXT416((uint)(1.0 - lensSample.super_Tuple2<pbrt::Point2,_float>.x)),
                           ZEXT416((uint)(lensSample.super_Tuple2<pbrt::Point2,_float>.x * fVar3)));
  auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)(1.0 - auVar18._0_4_)),
                            ZEXT416((uint)(auVar18._0_4_ * fVar4)));
  bVar7 = fVar17 != 0.0;
  fVar16 = (float)((uint)bVar7 * (int)(fVar16 / fVar17));
  auVar13._4_12_ = auVar13._4_12_;
  auVar13._0_4_ = fVar16;
  fVar12 = (float)((uint)bVar7 * (int)(fVar12 / fVar17) + (uint)!bVar7 * 0x3f800000);
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(auVar18._0_4_ * fVar16)),ZEXT416((uint)fVar12),auVar8);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * auVar18._0_4_)),auVar13,auVar8);
  auVar13 = vinsertps_avx(auVar9,auVar13,0x10);
  PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar13._0_8_;
  PVar19.super_Tuple3<pbrt::Point3,_float>.z =
       (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
  return (Point3f)PVar19.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f RealisticCamera::SampleExitPupil(Point2f pFilm, Point2f lensSample,
                                         Float *sampleBoundsArea) const {
    // Find exit pupil bound for sample distance from film center
    Float rFilm = std::sqrt(Sqr(pFilm.x) + Sqr(pFilm.y));
    int rIndex = rFilm / (film.Diagonal() / 2) * exitPupilBounds.size();
    rIndex = std::min<int>(exitPupilBounds.size() - 1, rIndex);
    Bounds2f pupilBounds = exitPupilBounds[rIndex];
    if (sampleBoundsArea != nullptr)
        *sampleBoundsArea = pupilBounds.Area();

    // Generate sample point inside exit pupil bound
    Point2f pLens = pupilBounds.Lerp(lensSample);

    // Return sample point rotated by angle of _pFilm_ with $+x$ axis
    Float sinTheta = (rFilm != 0) ? pFilm.y / rFilm : 0;
    Float cosTheta = (rFilm != 0) ? pFilm.x / rFilm : 1;
    return {cosTheta * pLens.x - sinTheta * pLens.y,
            sinTheta * pLens.x + cosTheta * pLens.y, LensRearZ()};
}